

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

CTypeID ffi_checkctype(lua_State *L,CTState *cts,TValue *param)

{
  uint *puVar1;
  int iVar2;
  ulong uVar3;
  ulong in_RDX;
  long in_RDI;
  GCcdata *cd;
  int errcode;
  CPState cp;
  GCstr *s;
  TValue *o;
  CPState *in_stack_00000120;
  ErrMsg in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  lua_State *in_stack_ffffffffffffff50;
  uint local_94;
  char *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  lua_State *in_stack_ffffffffffffffa0;
  uint local_4;
  
  puVar1 = *(uint **)(in_RDI + 0x10);
  if (puVar1 < *(uint **)(in_RDI + 0x18)) {
    if (puVar1[1] == 0xfffffffb) {
      iVar2 = lj_cparse(in_stack_00000120);
      if (iVar2 != 0) {
        lj_err_throw(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      }
      local_4 = local_94;
    }
    else {
      if (puVar1[1] != 0xfffffff5) goto LAB_0019804b;
      if ((in_RDX != 0) && (in_RDX < *(ulong *)(in_RDI + 0x18))) {
        lj_err_arg(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      }
      uVar3 = (ulong)*puVar1;
      if (*(short *)(uVar3 + 6) == 0x15) {
        local_4 = *(uint *)(uVar3 + 8);
      }
      else {
        local_4 = (uint)*(ushort *)(uVar3 + 6);
      }
    }
    return local_4;
  }
LAB_0019804b:
  lj_err_argtype(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                 in_stack_ffffffffffffff90);
}

Assistant:

static CTypeID ffi_checkctype(lua_State *L, CTState *cts, TValue *param)
{
  TValue *o = L->base;
  if (!(o < L->top)) {
  err_argtype:
    lj_err_argtype(L, 1, "C type");
  }
  if (tvisstr(o)) {  /* Parse an abstract C type declaration. */
    GCstr *s = strV(o);
    CPState cp;
    int errcode;
    cp.L = L;
    cp.cts = cts;
    cp.srcname = strdata(s);
    cp.p = strdata(s);
    cp.param = param;
    cp.mode = CPARSE_MODE_ABSTRACT|CPARSE_MODE_NOIMPLICIT;
    errcode = lj_cparse(&cp);
    if (errcode) lj_err_throw(L, errcode);  /* Propagate errors. */
    return cp.val.id;
  } else {
    GCcdata *cd;
    if (!tviscdata(o)) goto err_argtype;
    if (param && param < L->top) lj_err_arg(L, 1, LJ_ERR_FFI_NUMPARAM);
    cd = cdataV(o);
    return cd->ctypeid == CTID_CTYPEID ? *(CTypeID *)cdataptr(cd) : cd->ctypeid;
  }
}